

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Session.cpp
# Opt level: O2

void __thiscall FIX::Session::generateReject(Session *this,Message *message,int err,int field)

{
  bool bVar1;
  MsgType *pMVar2;
  uint64_t uVar3;
  SEQNUM SVar4;
  runtime_error *this_00;
  unsigned_long value;
  Session *this_01;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_02;
  Header *this_03;
  char *__s;
  string *psVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2f0;
  undefined1 local_2d0 [88];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_278;
  string beginString;
  MsgSeqNum msgSeqNum;
  string local_1e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1a0;
  Message reject;
  
  std::__cxx11::string::string
            ((string *)&beginString,
             (string *)&(this->m_sessionID).m_beginString.super_StringField.super_FieldBase.m_string
            );
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_2d0,"3",(allocator<char> *)&local_2f0);
  MsgType::MsgType((MsgType *)&msgSeqNum,(STRING *)local_2d0);
  newMessage(&reject,this,(MsgType *)&msgSeqNum);
  FieldBase::~FieldBase((FieldBase *)&msgSeqNum);
  std::__cxx11::string::~string((string *)local_2d0);
  this_03 = &message->m_header;
  Message::reverseRoute(&reject,this_03);
  fill(this,&reject.m_header);
  MsgSeqNum::MsgSeqNum(&msgSeqNum);
  pMVar2 = FieldMap::getField<FIX::MsgType>(&this_03->super_FieldMap);
  bVar1 = FieldMap::getFieldIfSet(&this_03->super_FieldMap,(FieldBase *)&msgSeqNum);
  if ((bVar1) &&
     (bVar1 = std::operator!=(&msgSeqNum.super_SeqNumField.super_FieldBase.m_string,""), bVar1)) {
    uVar3 = UInt64Field::getValue(&msgSeqNum.super_SeqNumField);
    RefSeqNum::RefSeqNum((RefSeqNum *)local_2d0,uVar3);
    FieldMap::setField(&reject.super_FieldMap,(FieldBase *)local_2d0,true);
    FieldBase::~FieldBase((FieldBase *)local_2d0);
  }
  bVar1 = std::operator>=(&beginString,"FIX.4.2");
  if (bVar1) {
    psVar5 = &(pMVar2->super_StringField).super_FieldBase.m_string;
    bVar1 = std::operator!=(psVar5,"");
    if (bVar1) {
      RefMsgType::RefMsgType((RefMsgType *)local_2d0,psVar5);
      FieldMap::setField(&reject.super_FieldMap,(FieldBase *)local_2d0,true);
      FieldBase::~FieldBase((FieldBase *)local_2d0);
    }
    bVar1 = std::operator==(&beginString,"FIX.4.2");
    if (((err < 0xc) && (bVar1)) || (bVar1 = std::operator>(&beginString,"FIX.4.2"), bVar1)) {
      SessionRejectReason::SessionRejectReason((SessionRejectReason *)local_2d0,err);
      FieldMap::setField(&reject.super_FieldMap,(FieldBase *)local_2d0,true);
      FieldBase::~FieldBase((FieldBase *)local_2d0);
    }
  }
  psVar5 = &(pMVar2->super_StringField).super_FieldBase.m_string;
  bVar1 = std::operator!=(psVar5,"A");
  if ((bVar1) && (bVar1 = std::operator!=(psVar5,"4"), bVar1)) {
    uVar3 = UInt64Field::getValue(&msgSeqNum.super_SeqNumField);
    SVar4 = SessionState::getNextTargetMsgSeqNum(&this->m_state);
    if (uVar3 == SVar4) {
      SessionState::incrNextTargetMsgSeqNum(&this->m_state);
    }
  }
  switch(err) {
  case 0:
    __s = "Invalid tag number";
    goto LAB_001afea3;
  case 1:
    __s = "Required tag missing";
    break;
  case 2:
    __s = "Tag not defined for this message type";
    break;
  default:
    std::operator+(&local_2f0,"Message ",&msgSeqNum.super_SeqNumField.super_FieldBase.m_string);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2d0,
                   &local_2f0," Rejected");
    SessionState::onEvent(&this->m_state,(string *)local_2d0);
    std::__cxx11::string::~string((string *)local_2d0);
    this_02 = &local_2f0;
    goto LAB_001b0061;
  case 4:
    __s = "Tag specified without a value";
    break;
  case 5:
    __s = "Value is incorrect (out of range) for this tag";
    break;
  case 6:
    __s = "Incorrect data format for value";
    break;
  case 9:
    __s = "CompID problem";
    break;
  case 10:
    __s = "SendingTime accuracy problem";
    break;
  case 0xb:
    __s = "Invalid MsgType";
    break;
  case 0xd:
    __s = "Tag appears more than once";
    break;
  case 0xe:
    __s = "Tag specified out of required order";
    break;
  case 0x10:
    __s = "Incorrect NumInGroup count for repeating group";
  }
  if (field == 0) {
    this_01 = (Session *)local_2d0;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)this_01,__s,(allocator<char> *)&local_2f0);
    populateRejectReason(this_01,&reject,(string *)local_2d0);
    std::__cxx11::string::~string((string *)local_2d0);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   (local_2d0 + 0x58),"Message ",
                   &msgSeqNum.super_SeqNumField.super_FieldBase.m_string);
    std::operator+(&local_2f0,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   (local_2d0 + 0x58)," Rejected: ");
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2d0,
                   &local_2f0,__s);
    SessionState::onEvent(&this->m_state,(string *)local_2d0);
    std::__cxx11::string::~string((string *)local_2d0);
    std::__cxx11::string::~string((string *)&local_2f0);
    this_02 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
              (local_2d0 + 0x58);
  }
  else {
LAB_001afea3:
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_2d0,__s,(allocator<char> *)&local_2f0);
    populateRejectReason(this,&reject,field,(string *)local_2d0);
    std::__cxx11::string::~string((string *)local_2d0);
    std::operator+(&local_1c0,"Message ",&msgSeqNum.super_SeqNumField.super_FieldBase.m_string);
    std::operator+(&local_1a0,&local_1c0," Rejected: ");
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   (local_2d0 + 0x58),&local_1a0,__s);
    std::operator+(&local_2f0,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   (local_2d0 + 0x58),":");
    IntTConvertor<unsigned_long>::convert_abi_cxx11_
              (&local_1e0,(IntTConvertor<unsigned_long> *)(long)field,value);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2d0,
                   &local_2f0,&local_1e0);
    SessionState::onEvent(&this->m_state,(string *)local_2d0);
    std::__cxx11::string::~string((string *)local_2d0);
    std::__cxx11::string::~string((string *)&local_1e0);
    std::__cxx11::string::~string((string *)&local_2f0);
    std::__cxx11::string::~string((string *)(local_2d0 + 0x58));
    std::__cxx11::string::~string((string *)&local_1a0);
    this_02 = &local_1c0;
  }
LAB_001b0061:
  std::__cxx11::string::~string((string *)this_02);
  if ((this->m_state).m_receivedLogon != false) {
    sendRaw(this,&reject,0);
    FieldBase::~FieldBase((FieldBase *)&msgSeqNum);
    Message::~Message(&reject);
    std::__cxx11::string::~string((string *)&beginString);
    return;
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this_00,"Tried to send a reject while not logged on");
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void Session::generateReject(const Message &message, int err, int field) {
  std::string beginString = m_sessionID.getBeginString();

  Message reject = newMessage(MsgType(MsgType_Reject));

  reject.reverseRoute(message.getHeader());
  fill(reject.getHeader());

  MsgSeqNum msgSeqNum;

  auto const &msgType = message.getHeader().getField<MsgType>();
  if (message.getHeader().getFieldIfSet(msgSeqNum)) {
    if (msgSeqNum.getString() != "") {
      reject.setField(RefSeqNum(msgSeqNum));
    }
  }

  if (beginString >= FIX::BeginString_FIX42) {
    if (msgType.getString() != "") {
      reject.setField(RefMsgType(msgType));
    }
    if ((beginString == FIX::BeginString_FIX42 && err <= SessionRejectReason_INVALID_MSGTYPE)
        || beginString > FIX::BeginString_FIX42) {
      reject.setField(SessionRejectReason(err));
    }
  }
  if (msgType != MsgType_Logon && msgType != MsgType_SequenceReset && msgSeqNum == getExpectedTargetNum()) {
    m_state.incrNextTargetMsgSeqNum();
  }

  const char *reason = 0;
  switch (err) {
  case SessionRejectReason_INVALID_TAG_NUMBER:
    reason = SessionRejectReason_INVALID_TAG_NUMBER_TEXT;
    break;
  case SessionRejectReason_REQUIRED_TAG_MISSING:
    reason = SessionRejectReason_REQUIRED_TAG_MISSING_TEXT;
    break;
  case SessionRejectReason_TAG_NOT_DEFINED_FOR_THIS_MESSAGE_TYPE:
    reason = SessionRejectReason_TAG_NOT_DEFINED_FOR_THIS_MESSAGE_TYPE_TEXT;
    break;
  case SessionRejectReason_TAG_SPECIFIED_WITHOUT_A_VALUE:
    reason = SessionRejectReason_TAG_SPECIFIED_WITHOUT_A_VALUE_TEXT;
    break;
  case SessionRejectReason_VALUE_IS_INCORRECT:
    reason = SessionRejectReason_VALUE_IS_INCORRECT_TEXT;
    break;
  case SessionRejectReason_INCORRECT_DATA_FORMAT_FOR_VALUE:
    reason = SessionRejectReason_INCORRECT_DATA_FORMAT_FOR_VALUE_TEXT;
    break;
  case SessionRejectReason_COMPID_PROBLEM:
    reason = SessionRejectReason_COMPID_PROBLEM_TEXT;
    break;
  case SessionRejectReason_SENDINGTIME_ACCURACY_PROBLEM:
    reason = SessionRejectReason_SENDINGTIME_ACCURACY_PROBLEM_TEXT;
    break;
  case SessionRejectReason_INVALID_MSGTYPE:
    reason = SessionRejectReason_INVALID_MSGTYPE_TEXT;
    break;
  case SessionRejectReason_TAG_APPEARS_MORE_THAN_ONCE:
    reason = SessionRejectReason_TAG_APPEARS_MORE_THAN_ONCE_TEXT;
    break;
  case SessionRejectReason_TAG_SPECIFIED_OUT_OF_REQUIRED_ORDER:
    reason = SessionRejectReason_TAG_SPECIFIED_OUT_OF_REQUIRED_ORDER_TEXT;
    break;
  case SessionRejectReason_INCORRECT_NUMINGROUP_COUNT_FOR_REPEATING_GROUP:
    reason = SessionRejectReason_INCORRECT_NUMINGROUP_COUNT_FOR_REPEATING_GROUP_TEXT;
    break;
  };

  if (reason && (field || err == SessionRejectReason_INVALID_TAG_NUMBER)) {
    populateRejectReason(reject, field, reason);
    m_state.onEvent(
        "Message " + msgSeqNum.getString() + " Rejected: " + reason + ":" + SEQNUM_CONVERTOR::convert(field));
  } else if (reason) {
    populateRejectReason(reject, reason);
    m_state.onEvent("Message " + msgSeqNum.getString() + " Rejected: " + reason);
  } else {
    m_state.onEvent("Message " + msgSeqNum.getString() + " Rejected");
  }

  if (!m_state.receivedLogon()) {
    throw std::runtime_error("Tried to send a reject while not logged on");
  }

  sendRaw(reject);
}